

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_GiveToChildren
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  AActor *receiver;
  AActor *pAVar2;
  int iVar3;
  char *__assertion;
  VMReturn *in_R9;
  AActor *this;
  int val;
  int in_stack_ffffffffffffff98;
  TThinkerIterator<AActor> it;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003e091e;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003e091e;
        }
        goto LAB_003e0886;
      }
    }
    else if (this != (AActor *)0x0) goto LAB_003e090e;
    this = (AActor *)0x0;
LAB_003e0886:
    TThinkerIterator<AActor>::TThinkerIterator
              ((TThinkerIterator<AActor> *)&it.super_FThinkerIterator,0x80);
    val = 0;
    iVar3 = 1;
    while( true ) {
      receiver = (AActor *)FThinkerIterator::Next(&it.super_FThinkerIterator,false);
      if (receiver == (AActor *)0x0) break;
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)&receiver->master);
      if (pAVar2 == this) {
        bVar1 = DoGiveInventory(receiver,true,param,defaultparam,numparam,in_R9,
                                in_stack_ffffffffffffff98);
        val = val + (uint)bVar1;
      }
    }
    if (numret < 1) {
      iVar3 = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x993,
                      "int AF_AActor_A_GiveToChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      VMReturn::SetInt(ret,val);
    }
    return iVar3;
  }
LAB_003e090e:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003e091e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x986,
                "int AF_AActor_A_GiveToChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_GiveToChildren)
{
	PARAM_SELF_PROLOGUE(AActor);

	TThinkerIterator<AActor> it;
	AActor *mo;
	int count = 0;

	while ((mo = it.Next()))
	{
		if (mo->master == self)
		{
			count += DoGiveInventory(mo, true, VM_ARGS_NAMES);
		}
	}
	ACTION_RETURN_INT(count);
}